

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

void __thiscall
RegVmLoweredBlock::AddInstruction
          (RegVmLoweredBlock *this,ExpressionContext *ctx,SynBase *location,
          RegVmInstructionCode code)

{
  RegVmLoweredInstruction *this_00;
  RegVmInstructionCode code_local;
  SynBase *location_local;
  ExpressionContext *ctx_local;
  RegVmLoweredBlock *this_local;
  
  this_00 = ExpressionContext::get<RegVmLoweredInstruction>(ctx);
  RegVmLoweredInstruction::RegVmLoweredInstruction
            (this_00,ctx->allocator,location,code,'\0','\0','\0',(VmConstant *)0x0);
  AddInstruction(this,ctx,this_00);
  return;
}

Assistant:

void RegVmLoweredBlock::AddInstruction(ExpressionContext &ctx, SynBase *location, RegVmInstructionCode code)
{
	AddInstruction(ctx, new (ctx.get<RegVmLoweredInstruction>()) RegVmLoweredInstruction(ctx.allocator, location, code, 0, 0, 0, NULL));
}